

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O0

bool __thiscall QCborStreamReaderPrivate::ensureStringIteration(QCborStreamReaderPrivate *this)

{
  CborError CVar1;
  QCborStreamReaderPrivate *in_RDI;
  CborError err;
  CborError in_stack_ffffffffffffffdc;
  bool local_1;
  
  if (((in_RDI->currentElement).flags & 8) == 0) {
    CVar1 = cbor_value_begin_string_iteration((CborValue *)0x8d5b78);
    if (CVar1 == CborNoError) {
      local_1 = true;
    }
    else {
      handleError(in_RDI,in_stack_ffffffffffffffdc);
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool QCborStreamReaderPrivate::ensureStringIteration()
{
    if (currentElement.flags & CborIteratorFlag_IteratingStringChunks)
        return true;

    CborError err = cbor_value_begin_string_iteration(&currentElement);
    if (!err)
        return true;
    handleError(err);
    return false;
}